

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O1

void __thiscall QpVector::resparsify(QpVector *this)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  long lVar5;
  
  this->num_nz = 0;
  if (0 < this->dim) {
    piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      dVar1 = pdVar4[lVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar2 = this->num_nz;
        this->num_nz = iVar2 + 1;
        piVar3[iVar2] = (int)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->dim);
  }
  return;
}

Assistant:

void resparsify() {
    num_nz = 0;
    for (HighsInt i = 0; i < dim; i++) {
      if (value[i] != 0.0) {
        index[num_nz++] = i;
      }
    }
  }